

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O1

bool __thiscall wallet::anon_unknown_5::WalletImpl::taprootEnabled(WalletImpl *this)

{
  bool bVar1;
  ScriptPubKeyMan *pSVar2;
  long in_FS_OFFSET;
  OutputType local_14;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = CWallet::IsLegacy((this->m_wallet).
                            super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    local_14 = BECH32M;
    pSVar2 = CWallet::GetScriptPubKeyMan
                       ((this->m_wallet).
                        super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        &local_14,false);
    bVar1 = pSVar2 != (ScriptPubKeyMan *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool taprootEnabled() override {
        if (m_wallet->IsLegacy()) return false;
        auto spk_man = m_wallet->GetScriptPubKeyMan(OutputType::BECH32M, /*internal=*/false);
        return spk_man != nullptr;
    }